

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::LitEnc_GetPriceMatched
                 (UInt16 *probs,UInt32 symbol,UInt32 matchByte,UInt32 *ProbPrices)

{
  uint uVar1;
  uint local_28;
  UInt32 local_24;
  UInt32 offs;
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 matchByte_local;
  UInt32 symbol_local;
  UInt16 *probs_local;
  
  local_24 = 0;
  local_28 = 0x100;
  ProbPrices_local._0_4_ = matchByte;
  ProbPrices_local._4_4_ = symbol | 0x100;
  do {
    local_24 = ProbPrices
               [(int)((uint)probs[local_28 + ((UInt32)ProbPrices_local << 1 & local_28) +
                                  (ProbPrices_local._4_4_ >> 8)] ^
                     -(ProbPrices_local._4_4_ >> 7 & 1) & 0x7ff) >> 4] + local_24;
    uVar1 = ProbPrices_local._4_4_ << 1;
    local_28 = (((UInt32)ProbPrices_local ^ ProbPrices_local._4_4_) << 1 ^ 0xffffffff) & local_28;
    ProbPrices_local._0_4_ = (UInt32)ProbPrices_local << 1;
    ProbPrices_local._4_4_ = uVar1;
  } while (uVar1 < 0x10000);
  return local_24;
}

Assistant:

static UInt32 LitEnc_GetPriceMatched(const CLzmaProb* probs, UInt32 symbol, UInt32 matchByte, UInt32* ProbPrices) {
  UInt32 price = 0;
  UInt32 offs = 0x100;
  symbol |= 0x100;
  do {
    matchByte <<= 1;
    price += GET_PRICEa(probs[offs + (matchByte & offs) + (symbol >> 8)], (symbol >> 7) & 1);
    symbol <<= 1;
    offs &= ~(matchByte ^ symbol);
  } while (symbol < 0x10000);
  return price;
}